

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowStorageDeviceType,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcFlowStorageDeviceType *in;
  
  in = (IfcFlowStorageDeviceType *)operator_new(0x1c8);
  *(undefined ***)&(in->super_IfcDistributionFlowElementType).field_0x1b0 = &PTR__Object_00806a70;
  *(undefined8 *)&in->field_0x1b8 = 0;
  *(char **)&in->field_0x1c0 = "IfcFlowStorageDeviceType";
  Assimp::IFC::Schema_2x3::IfcDistributionFlowElementType::IfcDistributionFlowElementType
            ((IfcDistributionFlowElementType *)in,&PTR_construction_vtable_24__00876d18);
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .super_IfcTypeProduct.super_IfcTypeObject = &PTR__IfcFlowStorageDeviceType_00876bc0;
  *(undefined ***)&(in->super_IfcDistributionFlowElementType).field_0x1b0 =
       &PTR__IfcFlowStorageDeviceType_00876d00;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = &PTR__IfcFlowStorageDeviceType_00876be8;
  (in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType.
  super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFlowStorageDeviceType_00876c10;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = &PTR__IfcFlowStorageDeviceType_00876c38;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .super_IfcTypeProduct.field_0x148 = &PTR__IfcFlowStorageDeviceType_00876c60;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .field_0x180 = &PTR__IfcFlowStorageDeviceType_00876c88;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .field_0x190 = &PTR__IfcFlowStorageDeviceType_00876cb0;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.field_0x1a0 =
       &PTR__IfcFlowStorageDeviceType_00876cd8;
  GenericFill<Assimp::IFC::Schema_2x3::IfcFlowStorageDeviceType>(db,params,in);
  return (Object *)
         (&(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
           super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcDistributionFlowElementType).
                             super_IfcDistributionElementType.super_IfcElementType.
                             super_IfcTypeProduct.super_IfcTypeObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }